

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

string * testing::internal::JoinAsKeyValueTuple
                   (vector<const_char_*,_std::allocator<const_char_*>_> *names,Strings *values)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  string *in_RDI;
  size_t i;
  anon_class_16_2_1175fbd1 build_one;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  ulong uVar5;
  string *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  allocator *paVar6;
  string local_90 [32];
  ulong local_70;
  string local_68 [4];
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  GTestLogSeverity in_stack_ffffffffffffffac;
  GTestLog *in_stack_ffffffffffffffb0;
  allocator local_2d [17];
  GTestLog local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RSI);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_18);
  bVar1 = IsTrue(sVar2 == sVar3);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0
                       ,in_stack_ffffffffffffff9c);
    poVar4 = GTestLog::GetStream(&local_1c);
    std::operator<<(poVar4,"Condition names.size() == values.size() failed. ");
    GTestLog::~GTestLog((GTestLog *)in_stack_ffffffffffffff30);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffff40);
  if (bVar1) {
    paVar6 = local_2d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar6);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else {
    __lhs = local_68;
    JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::operator()[abi_cxx11_
              ((anon_class_16_2_1175fbd1 *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (size_t)in_stack_ffffffffffffffa0);
    std::operator+((char *)__lhs,in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_68);
    local_70 = 1;
    while (uVar5 = local_70,
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_18), uVar5 < sVar2) {
      std::__cxx11::string::operator+=((string *)in_RDI,", ");
      JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::$_0::operator()[abi_cxx11_
                ((anon_class_16_2_1175fbd1 *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (size_t)in_stack_ffffffffffffffa0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_90);
      std::__cxx11::string::~string(local_90);
      local_70 = local_70 + 1;
    }
    std::__cxx11::string::operator+=((string *)in_RDI,")");
  }
  return in_RDI;
}

Assistant:

GTEST_API_ std::string JoinAsKeyValueTuple(
    const std::vector<const char*>& names, const Strings& values) {
  GTEST_CHECK_(names.size() == values.size());
  if (values.empty()) {
    return "";
  }
  const auto build_one = [&](const size_t i) {
    return std::string(names[i]) + ": " + values[i];
  };
  std::string result = "(" + build_one(0);
  for (size_t i = 1; i < values.size(); i++) {
    result += ", ";
    result += build_one(i);
  }
  result += ")";
  return result;
}